

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O3

int run_test_fs_poll_close_request(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  code *pcVar4;
  code *unaff_RBX;
  uint uVar5;
  ulong unaff_RBP;
  char *unaff_R14;
  undefined1 *unaff_R15;
  undefined1 *puVar6;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  undefined1 auStack_f38 [104];
  undefined1 auStack_ed0 [848];
  code *pcStack_b80;
  undefined1 auStack_b78 [104];
  undefined1 auStack_b10 [848];
  code *pcStack_7c0;
  char *pcStack_7b8;
  undefined1 *puStack_7b0;
  code *pcStack_7a8;
  undefined1 auStack_7a0 [104];
  undefined1 auStack_738 [848];
  code *pcStack_3e8;
  undefined1 local_3c0 [104];
  undefined1 local_358 [848];
  
  remove("testfile");
  iVar1 = uv_loop_init(local_358);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(local_358,local_3c0);
    if (iVar1 != 0) goto LAB_001522e9;
    iVar1 = uv_fs_poll_start(local_3c0,poll_cb_fail,"testfile",100);
    if (iVar1 != 0) goto LAB_001522ee;
    uv_close(local_3c0,close_cb);
    unaff_RBX = (code *)local_358;
    while (close_cb_called == 0) {
      uv_run(unaff_RBX,1);
    }
    if (close_cb_called != 1) {
      run_test_fs_poll_close_request_cold_6();
      goto LAB_001522e4;
    }
    iVar1 = uv_loop_close(local_358);
    if (iVar1 != 0) goto LAB_001522f3;
    unaff_RBX = (code *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_001522e4:
    run_test_fs_poll_close_request_cold_1();
LAB_001522e9:
    run_test_fs_poll_close_request_cold_2();
LAB_001522ee:
    run_test_fs_poll_close_request_cold_3();
LAB_001522f3:
    run_test_fs_poll_close_request_cold_4();
  }
  run_test_fs_poll_close_request_cold_5();
  puVar6 = auStack_7a0;
  pcStack_7a8 = (code *)0x152316;
  pcStack_3e8 = unaff_RBX;
  remove("testfile");
  pcStack_7a8 = (code *)0x152320;
  iVar1 = uv_loop_init(auStack_738);
  if (iVar1 == 0) {
    pcStack_7a8 = (code *)0x152335;
    iVar1 = uv_fs_poll_init(auStack_738,auStack_7a0);
    if (iVar1 != 0) goto LAB_0015241a;
    unaff_RBP = 10;
    unaff_RBX = poll_cb_fail;
    unaff_R14 = "testfile";
    do {
      pcStack_7a8 = (code *)0x152366;
      iVar1 = uv_fs_poll_start(auStack_7a0,poll_cb_fail,"testfile",100);
      if (iVar1 != 0) {
LAB_0015240b:
        pcStack_7a8 = (code *)0x152410;
        run_test_fs_poll_close_request_multi_start_stop_cold_3();
        goto LAB_00152410;
      }
      pcStack_7a8 = (code *)0x152376;
      iVar1 = uv_fs_poll_stop(auStack_7a0);
      if (iVar1 != 0) {
        pcStack_7a8 = (code *)0x15240b;
        run_test_fs_poll_close_request_multi_start_stop_cold_4();
        goto LAB_0015240b;
      }
      uVar5 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar5;
    } while (uVar5 != 0);
    pcStack_7a8 = (code *)0x152391;
    uv_close(auStack_7a0,close_cb);
    unaff_RBX = (code *)auStack_738;
    while (close_cb_called == 0) {
      pcStack_7a8 = (code *)0x1523ad;
      uv_run(unaff_RBX,1);
    }
    if (close_cb_called != 1) {
LAB_00152410:
      pcStack_7a8 = (code *)0x152415;
      run_test_fs_poll_close_request_multi_start_stop_cold_7();
      unaff_R15 = auStack_7a0;
      goto LAB_00152415;
    }
    pcStack_7a8 = (code *)0x1523be;
    iVar1 = uv_loop_close(auStack_738);
    if (iVar1 != 0) goto LAB_0015241f;
    pcStack_7a8 = (code *)0x1523c7;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_7a8 = (code *)0x1523db;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_7a8 = (code *)0x1523e5;
    uv_run(unaff_RBX,0);
    pcStack_7a8 = (code *)0x1523ea;
    uVar3 = uv_default_loop();
    pcStack_7a8 = (code *)0x1523f2;
    iVar1 = uv_loop_close(uVar3);
    puVar6 = auStack_7a0;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_00152415:
    pcStack_7a8 = (code *)0x15241a;
    run_test_fs_poll_close_request_multi_start_stop_cold_1();
LAB_0015241a:
    puVar6 = unaff_R15;
    pcStack_7a8 = (code *)0x15241f;
    run_test_fs_poll_close_request_multi_start_stop_cold_2();
LAB_0015241f:
    pcStack_7a8 = (code *)0x152424;
    run_test_fs_poll_close_request_multi_start_stop_cold_5();
  }
  pcStack_7a8 = run_test_fs_poll_close_request_multi_stop_start;
  run_test_fs_poll_close_request_multi_start_stop_cold_6();
  pcVar4 = (code *)auStack_b78;
  pcStack_b80 = (code *)0x152442;
  pcStack_7c0 = unaff_RBX;
  pcStack_7b8 = unaff_R14;
  puStack_7b0 = puVar6;
  pcStack_7a8 = (code *)unaff_RBP;
  remove("testfile");
  pcStack_b80 = (code *)0x15244c;
  iVar1 = uv_loop_init(auStack_b10);
  if (iVar1 == 0) {
    pcStack_b80 = (code *)0x152461;
    iVar1 = uv_fs_poll_init(auStack_b10,auStack_b78);
    if (iVar1 != 0) goto LAB_00152546;
    iVar1 = 10;
    do {
      pcStack_b80 = (code *)0x152487;
      iVar2 = uv_fs_poll_stop(auStack_b78);
      if (iVar2 != 0) {
LAB_00152537:
        pcStack_b80 = (code *)0x15253c;
        run_test_fs_poll_close_request_multi_stop_start_cold_3();
        goto LAB_0015253c;
      }
      pcStack_b80 = (code *)0x1524a2;
      iVar2 = uv_fs_poll_start(auStack_b78,poll_cb_fail,"testfile",100);
      if (iVar2 != 0) {
        pcStack_b80 = (code *)0x152537;
        run_test_fs_poll_close_request_multi_stop_start_cold_4();
        goto LAB_00152537;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    pcStack_b80 = (code *)0x1524bd;
    uv_close(auStack_b78,close_cb);
    pcVar4 = (code *)auStack_b10;
    while (close_cb_called == 0) {
      pcStack_b80 = (code *)0x1524d9;
      uv_run(pcVar4,1);
    }
    if (close_cb_called != 1) {
LAB_0015253c:
      pcStack_b80 = (code *)0x152541;
      run_test_fs_poll_close_request_multi_stop_start_cold_7();
      unaff_RBX = pcVar4;
      goto LAB_00152541;
    }
    pcStack_b80 = (code *)0x1524ea;
    iVar1 = uv_loop_close(auStack_b10);
    if (iVar1 != 0) goto LAB_0015254b;
    pcStack_b80 = (code *)0x1524f3;
    pcVar4 = (code *)uv_default_loop();
    pcStack_b80 = (code *)0x152507;
    uv_walk(pcVar4,close_walk_cb,0);
    pcStack_b80 = (code *)0x152511;
    uv_run(pcVar4,0);
    pcStack_b80 = (code *)0x152516;
    uVar3 = uv_default_loop();
    pcStack_b80 = (code *)0x15251e;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_00152541:
    pcStack_b80 = (code *)0x152546;
    run_test_fs_poll_close_request_multi_stop_start_cold_1();
LAB_00152546:
    pcVar4 = unaff_RBX;
    pcStack_b80 = (code *)0x15254b;
    run_test_fs_poll_close_request_multi_stop_start_cold_2();
LAB_0015254b:
    pcStack_b80 = (code *)0x152550;
    run_test_fs_poll_close_request_multi_stop_start_cold_5();
  }
  pcStack_b80 = run_test_fs_poll_close_request_stop_when_active;
  run_test_fs_poll_close_request_multi_stop_start_cold_6();
  pcStack_b80 = pcVar4;
  remove("testfile");
  iVar1 = uv_loop_init(auStack_ed0);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(auStack_ed0,auStack_f38);
    if (iVar1 != 0) goto LAB_00152663;
    iVar1 = uv_fs_poll_start(auStack_f38,poll_cb_noop,"testfile",100);
    if (iVar1 != 0) goto LAB_00152668;
    uv_run(auStack_ed0,1);
    iVar1 = uv_fs_poll_stop(auStack_f38);
    if (iVar1 != 0) goto LAB_0015266d;
    uv_run(auStack_ed0,1);
    uv_close(auStack_f38,close_cb);
    uv_run(auStack_ed0,1);
    if (close_cb_called != 1) goto LAB_00152672;
    iVar1 = uv_loop_close(auStack_ed0);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015267c;
    }
  }
  else {
    run_test_fs_poll_close_request_stop_when_active_cold_1();
LAB_00152663:
    run_test_fs_poll_close_request_stop_when_active_cold_2();
LAB_00152668:
    run_test_fs_poll_close_request_stop_when_active_cold_3();
LAB_0015266d:
    run_test_fs_poll_close_request_stop_when_active_cold_4();
LAB_00152672:
    run_test_fs_poll_close_request_stop_when_active_cold_5();
  }
  run_test_fs_poll_close_request_stop_when_active_cold_6();
LAB_0015267c:
  run_test_fs_poll_close_request_stop_when_active_cold_7();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_close_request) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;

  remove(FIXTURE);

  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_fs_poll_init(&loop, &poll_handle));
  ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT(close_cb_called == 1);

  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}